

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall icu_63::OffsetList::setMaxLength(OffsetList *this,int32_t maxLength)

{
  UBool *pUVar1;
  UBool *l;
  int32_t maxLength_local;
  OffsetList *this_local;
  
  if (maxLength < 0x11) {
    this->capacity = 0x10;
  }
  else {
    pUVar1 = (UBool *)uprv_malloc_63((long)maxLength);
    if (pUVar1 != (UBool *)0x0) {
      this->list = pUVar1;
      this->capacity = maxLength;
    }
  }
  memset(this->list,0,(long)this->capacity);
  return;
}

Assistant:

void setMaxLength(int32_t maxLength) {
        if(maxLength<=(int32_t)sizeof(staticList)) {
            capacity=(int32_t)sizeof(staticList);
        } else {
            UBool *l=(UBool *)uprv_malloc(maxLength);
            if(l!=NULL) {
                list=l;
                capacity=maxLength;
            }
        }
        uprv_memset(list, 0, capacity);
    }